

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

boolean boulder_hits_pool(obj *otmp,int rx,int ry,boolean pushing)

{
  boolean bVar1;
  boolean bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  trap *ttmp_00;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  bool bVar9;
  char *bp;
  trap *ttmp;
  int chance;
  schar ltyp;
  char *what;
  boolean swamp;
  boolean fills_up;
  boolean lava;
  boolean pushing_local;
  int ry_local;
  int rx_local;
  obj *otmp_local;
  
  if ((otmp == (obj *)0x0) || (otmp->otyp != 0x214)) {
    warning("Not a boulder?");
    return '\0';
  }
  bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level);
  if (bVar1 != '\0') {
    return '\0';
  }
  bVar1 = is_pool(level,rx,ry);
  if (((bVar1 == '\0') && (bVar1 = is_lava(level,rx,ry), bVar1 == '\0')) &&
     (bVar1 = is_swamp(level,rx,ry), bVar1 == '\0')) {
    return '\0';
  }
  bVar1 = is_lava(level,rx,ry);
  bVar2 = is_swamp(level,rx,ry);
  pcVar5 = waterbody_name((xchar)rx,(xchar)ry);
  cVar3 = level->locations[rx][ry].typ;
  iVar4 = rn2(10);
  if (bVar2 == '\0') {
    if (bVar1 == '\0') {
      bVar9 = iVar4 != 0;
    }
    else {
      bVar9 = iVar4 == 0;
    }
  }
  else {
    bVar9 = true;
  }
  if (bVar9) {
    ttmp_00 = t_at(level,rx,ry);
    if (cVar3 == '\x14') {
      *(uint *)&level->locations[rx][ry].field_0x6 =
           *(uint *)&level->locations[rx][ry].field_0x6 & 0xfffffe0f |
           (*(uint *)&level->locations[rx][ry].field_0x6 >> 4 & 3) << 4;
      *(uint *)&level->locations[rx][ry].field_0x6 =
           *(uint *)&level->locations[rx][ry].field_0x6 & 0xfffffe0f |
           (*(uint *)&level->locations[rx][ry].field_0x6 >> 4 & 0x1f | 0xc) << 4;
    }
    else {
      level->locations[rx][ry].typ = '\x19';
    }
    if (ttmp_00 != (trap *)0x0) {
      delfloortrap(ttmp_00);
    }
    bury_objs(rx,ry);
    newsym(rx,ry);
    if (pushing != '\0') {
      if (u.usteed == (monst *)0x0) {
        pcVar6 = xname(otmp);
        pcVar6 = the(pcVar6);
        pline("You push %s into the %s.",pcVar6,pcVar5);
      }
      else {
        pcVar6 = y_monnam(u.usteed);
        cVar3 = highc(*pcVar6);
        *pcVar6 = cVar3;
        pcVar7 = xname(otmp);
        pcVar7 = the(pcVar7);
        pline("%s pushes %s into the %s.",pcVar6,pcVar7,pcVar5);
      }
      if ((flags.verbose != '\0') &&
         ((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
           && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
        pline("Now you can cross it!");
      }
    }
  }
  if ((bVar9) && (pushing != '\0')) goto LAB_00190c13;
  if (((byte)u._1052_1_ >> 1 & 1) == 0) {
    if (pushing == '\0') {
      if ((viz_array[ry][rx] & 2U) != 0) goto LAB_0019090c;
LAB_0019094d:
      if (flags.soundok != '\0') {
        pcVar5 = "";
        if (bVar1 != '\0') {
          pcVar5 = " sizzling";
        }
        You_hear("a%s splash.",pcVar5);
      }
    }
    else {
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) goto LAB_0019094d;
LAB_0019090c:
      pcVar6 = xname(otmp);
      pcVar6 = the(pcVar6);
      pcVar7 = "falls into";
      if (bVar9) {
        pcVar7 = "fills";
      }
      pline("There is a large splash as %s %s the %s.",pcVar6,pcVar7,pcVar5);
    }
    wake_nearto(rx,ry,0x28);
  }
  if (((bVar9) && (((byte)u._1052_1_ >> 1 & 1) != 0)) &&
     (iVar4 = dist2(rx,ry,(int)u.ux,(int)u.uy), iVar4 == 0)) {
    u._1052_1_ = u._1052_1_ & 0xfd;
    doredraw();
    vision_full_recalc = '\x01';
    pline("You find yourself on dry land again!");
  }
  else if ((bVar1 == '\0') || (iVar4 = dist2(rx,ry,(int)u.ux,(int)u.uy), 2 < iVar4)) {
    if ((!bVar9) && (flags.verbose != '\0')) {
      if (pushing == '\0') {
        if ((viz_array[ry][rx] & 2U) == 0) goto LAB_00190c13;
      }
      else if (((u.uprops[0x1e].intrinsic != 0) ||
               (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
              ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) goto LAB_00190c13;
      pline("It sinks without a trace!");
    }
  }
  else {
    if (((u.uprops[1].intrinsic != 0) || (u.uprops[1].extrinsic != 0)) ||
       (bVar9 = false, (youmonst.mintrinsics & 1) != 0)) {
      bVar9 = false;
      if ((((u.uprops[1].intrinsic & 0x4000000) != 0) &&
          (bVar9 = false, (u.uprops[1].intrinsic & 0xfbffffff) == 0)) &&
         (bVar9 = false, u.uprops[1].extrinsic == 0)) {
        bVar9 = (youmonst.mintrinsics & 1) == 0;
      }
      bVar9 = (bool)(bVar9 ^ 1);
    }
    uVar8 = 0x21;
    if (bVar9) {
      uVar8 = 0x2e;
    }
    pline("You are hit by molten lava%c",uVar8);
    iVar4 = dice(3,6);
    fire_damageu(iVar4,(monst *)0x0,"molten lava",1,0,'\0','\x01');
  }
LAB_00190c13:
  if (pushing == '\0') {
    obfree(otmp,(obj *)0x0);
  }
  else {
    delobj(otmp);
  }
  return '\x01';
}

Assistant:

boolean boulder_hits_pool(struct obj *otmp, int rx, int ry, boolean pushing)
{
	if (!otmp || otmp->otyp != BOULDER)
	    warning("Not a boulder?");
	else if (!Is_waterlevel(&u.uz) &&
		 (is_pool(level, rx,ry) || is_lava(level, rx,ry) ||
		  is_swamp(level, rx,ry))) {
	    boolean lava = is_lava(level, rx,ry), fills_up;
	    boolean swamp = is_swamp(level, rx,ry);
	    const char *what = waterbody_name(rx,ry);
	    schar ltyp = level->locations[rx][ry].typ;
	    int chance = rn2(10);		/* water: 90%; lava: 10% */
	    fills_up = swamp ? TRUE : lava ? chance == 0 : chance != 0;

	    if (fills_up) {
		struct trap *ttmp = t_at(level, rx, ry);

		if (ltyp == DRAWBRIDGE_UP) {
		    level->locations[rx][ry].drawbridgemask &= ~DB_UNDER; /* clear lava */
		    level->locations[rx][ry].drawbridgemask |= DB_FLOOR;
		} else
		    level->locations[rx][ry].typ = ROOM;

		if (ttmp) delfloortrap(ttmp);
		bury_objs(rx, ry);
		
		newsym(rx,ry);
		if (pushing) {
		    if (u.usteed) {
			char *bp = y_monnam(u.usteed);
			*bp = highc(*bp); /* bp points to a static buffer */
			pline("%s pushes %s into the %s.",
			    bp, the(xname(otmp)), what);
		    } else
			pline("You push %s into the %s.", the(xname(otmp)), what);
		    if (flags.verbose && !Blind)
			pline("Now you can cross it!");
		    /* no splashing in this case */
		}
	    }
	    if (!fills_up || !pushing) {	/* splashing occurs */
		if (!u.uinwater) {
		    if (pushing ? !Blind : cansee(rx,ry)) {
			pline("There is a large splash as %s %s the %s.",
			      the(xname(otmp)), fills_up? "fills":"falls into",
			      what);
		    } else if (flags.soundok)
			You_hear("a%s splash.", lava ? " sizzling" : "");
		    wake_nearto(rx, ry, 40);
		}

		if (fills_up && u.uinwater && distu(rx,ry) == 0) {
		    u.uinwater = 0;
		    doredraw();
		    vision_full_recalc = 1;
		    pline("You find yourself on dry land again!");
		} else if (lava && distu(rx,ry) <= 2) {
		    pline("You are hit by molten lava%c",
			  FFire_resistance ? '.' : '!');
		    fire_damageu(dice(3, 6), NULL, "molten lava", KILLED_BY,
				 0, FALSE, TRUE);
		} else if (!fills_up && flags.verbose &&
			   (pushing ? !Blind : cansee(rx,ry)))
		    pline("It sinks without a trace!");
	    }

	    /* boulder is now gone */
	    if (pushing) delobj(otmp);
	    else obfree(otmp, NULL);
	    return TRUE;
	}
	return FALSE;
}